

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O3

vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_> *
vkt::wsi::anon_unknown_0::generateSwapchainParameterCases
          (vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
           *__return_storage_ptr__,Type wsiType,TestDimension dimension,InstanceInterface *vki,
          VkPhysicalDevice physicalDevice,VkSurfaceKHR surface)

{
  VkExtent2D VVar1;
  VkExtent2D VVar2;
  undefined4 uVar3;
  uint uVar4;
  PlatformProperties *pPVar5;
  pointer pVVar6;
  pointer extraout_RAX;
  iterator iVar7;
  pointer extraout_RAX_00;
  pointer extraout_RAX_01;
  deUint32 dVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  VkCompositeAlphaFlagBitsKHR VVar12;
  VkSurfaceTransformFlagBitsKHR VVar13;
  uint uVar14;
  VkSwapchainCreateInfoKHR *pVVar15;
  const_iterator curFmt;
  pointer pVVar16;
  int ndx;
  deUint32 imageCount;
  byte bVar17;
  VkSurfaceCapabilitiesKHR capabilities;
  vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> presentModes;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> formats;
  VkSurfaceCapabilitiesKHR local_fc;
  vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> local_c8;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> local_b0;
  VkSwapchainCreateInfoKHR local_98;
  
  bVar17 = 0;
  ::vk::wsi::getPhysicalDeviceSurfaceCapabilities(&local_fc,vki,physicalDevice,surface);
  ::vk::wsi::getPhysicalDeviceSurfaceFormats(&local_b0,vki,physicalDevice,surface);
  ::vk::wsi::getPhysicalDeviceSurfacePresentModes(&local_c8,vki,physicalDevice,surface);
  pPVar5 = ::vk::wsi::getPlatformProperties(wsiType);
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar6 = (pointer)(ulong)local_fc.supportedTransforms;
  local_98.preTransform = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
  if ((local_fc.supportedTransforms & 1) == 0) {
    local_98.preTransform = local_fc.currentTransform;
  }
  local_98.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
  local_98.pNext = (void *)0x0;
  local_98.flags = 0;
  local_98.surface.m_internal = 0;
  local_98.minImageCount = local_fc.minImageCount;
  local_98.imageFormat =
       (local_b0.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
        ._M_impl.super__Vector_impl_data._M_start)->format;
  local_98.imageColorSpace =
       (local_b0.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
        ._M_impl.super__Vector_impl_data._M_start)->colorSpace;
  local_98.imageExtent.height = local_fc.minImageExtent.height;
  local_98.imageExtent.width = local_fc.minImageExtent.width;
  if (pPVar5->swapchainExtent != SWAPCHAIN_EXTENT_SETS_WINDOW_SIZE) {
    local_98.imageExtent = local_fc.currentExtent;
  }
  local_98.imageArrayLayers = 1;
  local_98.imageUsage = 0x10;
  local_98.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_98.queueFamilyIndexCount = 0;
  local_98.pQueueFamilyIndices = (deUint32 *)0x0;
  local_98.compositeAlpha = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
  local_98.presentMode = VK_PRESENT_MODE_FIFO_KHR;
  local_98.clipped = 0;
  local_98.oldSwapchain.m_internal = 0;
  switch(dimension) {
  case TEST_DIMENSION_MIN_IMAGE_COUNT:
    pVVar6 = (pointer)(ulong)local_fc.maxImageCount;
    uVar11 = local_fc.minImageCount + 0x10;
    if (local_fc.maxImageCount != 0) {
      uVar11 = local_fc.maxImageCount;
    }
    uVar4 = 0x10;
    if (uVar11 < 0x10) {
      uVar4 = uVar11;
    }
    if (0x10 < local_fc.minImageCount) {
      uVar4 = local_fc.minImageCount;
    }
    if (local_fc.minImageCount <= uVar4) {
      iVar7._M_current = (VkSwapchainCreateInfoKHR *)0x0;
      dVar8 = local_fc.minImageCount;
      do {
        if (iVar7._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
          _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                    ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                      *)__return_storage_ptr__,iVar7,&local_98);
          iVar7._M_current =
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          pVVar6 = extraout_RAX;
        }
        else {
          pVVar15 = &local_98;
          for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
            uVar3 = *(undefined4 *)&pVVar15->field_0x4;
            (iVar7._M_current)->sType = pVVar15->sType;
            *(undefined4 *)&(iVar7._M_current)->field_0x4 = uVar3;
            pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + (ulong)bVar17 * -0x10 + 8);
            iVar7._M_current = iVar7._M_current + (ulong)bVar17 * -0x10 + 8;
          }
          iVar7._M_current =
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish + 1;
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current;
        }
        iVar7._M_current[-1].minImageCount = dVar8;
        dVar8 = dVar8 + 1;
      } while (dVar8 <= uVar4);
    }
    break;
  case TEST_DIMENSION_IMAGE_FORMAT:
    pVVar6 = (pointer)local_b0.
                      super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (local_b0.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_b0.super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar7._M_current = (VkSwapchainCreateInfoKHR *)0x0;
      pVVar16 = (pointer)local_b0.
                         super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (iVar7._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
          _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                    ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                      *)__return_storage_ptr__,iVar7,&local_98);
          iVar7._M_current =
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          pVVar6 = (pointer)local_b0.
                            super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          pVVar15 = &local_98;
          for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
            uVar3 = *(undefined4 *)&pVVar15->field_0x4;
            (iVar7._M_current)->sType = pVVar15->sType;
            *(undefined4 *)&(iVar7._M_current)->field_0x4 = uVar3;
            pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + (ulong)bVar17 * -0x10 + 8);
            iVar7._M_current = iVar7._M_current + (ulong)bVar17 * -0x10 + 8;
          }
          iVar7._M_current =
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish + 1;
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current;
        }
        uVar3 = *(undefined4 *)&pVVar16->field_0x4;
        iVar7._M_current[-1].imageFormat = pVVar16->sType;
        iVar7._M_current[-1].imageColorSpace = uVar3;
        pVVar16 = (pointer)&pVVar16->pNext;
      } while (pVVar16 != pVVar6);
    }
    break;
  case TEST_DIMENSION_IMAGE_EXTENT:
    if (pPVar5->swapchainExtent - SWAPCHAIN_EXTENT_SETS_WINDOW_SIZE < 2) {
      iVar7._M_current = (VkSwapchainCreateInfoKHR *)0x0;
      lVar9 = 0;
      dVar8 = local_fc.minImageExtent.height;
      do {
        if (iVar7._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
          _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                    ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                      *)__return_storage_ptr__,iVar7,&local_98);
          iVar7._M_current =
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          dVar8 = local_fc.minImageExtent.height;
        }
        else {
          pVVar15 = &local_98;
          for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
            uVar3 = *(undefined4 *)&pVVar15->field_0x4;
            (iVar7._M_current)->sType = pVVar15->sType;
            *(undefined4 *)&(iVar7._M_current)->field_0x4 = uVar3;
            pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + (ulong)bVar17 * -0x10 + 8);
            iVar7._M_current = iVar7._M_current + (ulong)bVar17 * -0x10 + 8;
          }
          iVar7._M_current =
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish + 1;
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current;
        }
        uVar11 = (&wsi::(anonymous_namespace)::
                   generateSwapchainParameterCases(vk::wsi::Type,vkt::wsi::(anonymous_namespace)::TestDimension,vk::VkSurfaceCapabilitiesKHR_const&,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>const&,std::vector<vk::VkPresentModeKHR,std::allocator<vk::VkPresentModeKHR>>const&)
                   ::s_testSizes)[lVar9 * 2];
        uVar4 = (&DAT_00b0dcb4)[lVar9 * 2];
        uVar14 = local_fc.maxImageExtent.width;
        if (uVar11 < local_fc.maxImageExtent.width) {
          uVar14 = uVar11;
        }
        if (uVar11 < local_fc.minImageExtent.width) {
          uVar14 = local_fc.minImageExtent.width;
        }
        iVar7._M_current[-1].imageExtent.width = uVar14;
        uVar11 = local_fc.maxImageExtent.height;
        if (uVar4 < local_fc.maxImageExtent.height) {
          uVar11 = uVar4;
        }
        if (uVar4 < dVar8) {
          uVar11 = dVar8;
        }
        iVar7._M_current[-1].imageExtent.height = uVar11;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 5);
      if (pPVar5->swapchainExtent != SWAPCHAIN_EXTENT_SETS_WINDOW_SIZE) {
        if (iVar7._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0071bea6;
        pVVar15 = &local_98;
        for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
          uVar3 = *(undefined4 *)&pVVar15->field_0x4;
          (iVar7._M_current)->sType = pVVar15->sType;
          *(undefined4 *)&(iVar7._M_current)->field_0x4 = uVar3;
          pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + ((ulong)bVar17 * -2 + 1) * 8);
          iVar7._M_current = iVar7._M_current + (ulong)bVar17 * -0x10 + 8;
        }
        pVVar6 = (__return_storage_ptr__->
                 super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1;
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_finish = pVVar6;
        goto LAB_0071beba;
      }
    }
    else {
      iVar7._M_current = (VkSwapchainCreateInfoKHR *)0x0;
LAB_0071bea6:
      std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
      _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                  *)__return_storage_ptr__,iVar7,&local_98);
      pVVar6 = (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
LAB_0071beba:
      pVVar6[-1].imageExtent = local_fc.currentExtent;
      if (pPVar5->swapchainExtent == SWAPCHAIN_EXTENT_MUST_MATCH_WINDOW_SIZE) break;
      iVar7._M_current =
           (__return_storage_ptr__->
           super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (iVar7._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
      _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                  *)__return_storage_ptr__,iVar7,&local_98);
      pVVar6 = (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      pVVar15 = &local_98;
      for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
        uVar3 = *(undefined4 *)&pVVar15->field_0x4;
        (iVar7._M_current)->sType = pVVar15->sType;
        *(undefined4 *)&(iVar7._M_current)->field_0x4 = uVar3;
        pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + ((ulong)bVar17 * -2 + 1) * 8);
        iVar7._M_current = iVar7._M_current + (ulong)bVar17 * -0x10 + 8;
      }
      pVVar6 = (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish + 1;
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish = pVVar6;
    }
    VVar1.height = local_fc.minImageExtent.height;
    VVar1.width = local_fc.minImageExtent.width;
    pVVar6[-1].imageExtent = VVar1;
    iVar7._M_current =
         (__return_storage_ptr__->
         super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
      _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                  *)__return_storage_ptr__,iVar7,&local_98);
      pVVar6 = (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      pVVar15 = &local_98;
      for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
        uVar3 = *(undefined4 *)&pVVar15->field_0x4;
        (iVar7._M_current)->sType = pVVar15->sType;
        *(undefined4 *)&(iVar7._M_current)->field_0x4 = uVar3;
        pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + ((ulong)bVar17 * -2 + 1) * 8);
        iVar7._M_current = iVar7._M_current + (ulong)bVar17 * -0x10 + 8;
      }
      pVVar6 = (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish + 1;
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish = pVVar6;
    }
    VVar2.height = local_fc.maxImageExtent.height;
    VVar2.width = local_fc.maxImageExtent.width;
    pVVar6[-1].imageExtent = VVar2;
    break;
  case TEST_DIMENSION_IMAGE_ARRAY_LAYERS:
    pVVar6 = (pointer)(ulong)local_fc.maxImageArrayLayers;
    if (local_fc.maxImageArrayLayers != 0) {
      uVar11 = 0x10;
      if (local_fc.maxImageArrayLayers < 0x10) {
        uVar11 = local_fc.maxImageArrayLayers;
      }
      dVar8 = 1;
      iVar7._M_current = (VkSwapchainCreateInfoKHR *)0x0;
      do {
        if (iVar7._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
          _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                    ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                      *)__return_storage_ptr__,iVar7,&local_98);
          iVar7._M_current =
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          pVVar15 = &local_98;
          for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
            uVar3 = *(undefined4 *)&pVVar15->field_0x4;
            (iVar7._M_current)->sType = pVVar15->sType;
            *(undefined4 *)&(iVar7._M_current)->field_0x4 = uVar3;
            pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + (ulong)bVar17 * -0x10 + 8);
            iVar7._M_current = iVar7._M_current + (ulong)bVar17 * -0x10 + 8;
          }
          iVar7._M_current =
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish + 1;
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current;
        }
        iVar7._M_current[-1].imageArrayLayers = dVar8;
        uVar4 = (dVar8 - uVar11) + 1;
        pVVar6 = (pointer)(ulong)uVar4;
        dVar8 = dVar8 + 1;
      } while (uVar4 != 1);
    }
    break;
  case TEST_DIMENSION_IMAGE_USAGE:
    pVVar6 = (pointer)(ulong)local_fc.supportedUsageFlags;
    if (local_fc.supportedUsageFlags != 0) {
      uVar11 = 1;
      iVar7._M_current = (VkSwapchainCreateInfoKHR *)0x0;
      do {
        if ((uVar11 & ~(uint)pVVar6) == 0) {
          if (iVar7._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
            _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                      ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                        *)__return_storage_ptr__,iVar7,&local_98);
            iVar7._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            pVVar6 = (pointer)(ulong)local_fc.supportedUsageFlags;
          }
          else {
            pVVar15 = &local_98;
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              uVar3 = *(undefined4 *)&pVVar15->field_0x4;
              (iVar7._M_current)->sType = pVVar15->sType;
              *(undefined4 *)&(iVar7._M_current)->field_0x4 = uVar3;
              pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + (ulong)bVar17 * -0x10 + 8);
              iVar7._M_current = iVar7._M_current + (ulong)bVar17 * -0x10 + 8;
            }
            iVar7._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1;
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current;
          }
          iVar7._M_current[-1].imageUsage = uVar11;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 <= (uint)pVVar6);
    }
    break;
  case TEST_DIMENSION_IMAGE_SHARING_MODE:
    std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
    _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
              ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>> *)
               __return_storage_ptr__,(iterator)0x0,&local_98);
    iVar7._M_current =
         (__return_storage_ptr__->
         super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    pVVar15 = (__return_storage_ptr__->
              super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar7._M_current[-1].imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
    if (iVar7._M_current == pVVar15) {
      std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
      _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                  *)__return_storage_ptr__,iVar7,&local_98);
      pVVar6 = (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      pVVar15 = &local_98;
      for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
        uVar3 = *(undefined4 *)&pVVar15->field_0x4;
        (iVar7._M_current)->sType = pVVar15->sType;
        *(undefined4 *)&(iVar7._M_current)->field_0x4 = uVar3;
        pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + ((ulong)bVar17 * -2 + 1) * 8);
        iVar7._M_current = iVar7._M_current + (ulong)bVar17 * -0x10 + 8;
      }
      pVVar6 = (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish + 1;
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish = pVVar6;
    }
    pVVar6[-1].imageSharingMode = VK_SHARING_MODE_CONCURRENT;
    break;
  case TEST_DIMENSION_PRE_TRANSFORM:
    if (local_fc.supportedTransforms != 0) {
      VVar13 = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
      iVar7._M_current = (VkSwapchainCreateInfoKHR *)0x0;
      do {
        if ((VVar13 & (VkSurfaceTransformFlagBitsKHR)pVVar6) != 0) {
          if (iVar7._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
            _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                      ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                        *)__return_storage_ptr__,iVar7,&local_98);
            iVar7._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            pVVar6 = (pointer)(ulong)local_fc.supportedTransforms;
          }
          else {
            pVVar15 = &local_98;
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              uVar3 = *(undefined4 *)&pVVar15->field_0x4;
              (iVar7._M_current)->sType = pVVar15->sType;
              *(undefined4 *)&(iVar7._M_current)->field_0x4 = uVar3;
              pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + (ulong)bVar17 * -0x10 + 8);
              iVar7._M_current = iVar7._M_current + (ulong)bVar17 * -0x10 + 8;
            }
            iVar7._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1;
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current;
          }
          iVar7._M_current[-1].preTransform = VVar13;
        }
        VVar13 = VVar13 * 2;
      } while (VVar13 <= (VkSurfaceTransformFlagBitsKHR)pVVar6);
    }
    break;
  case TEST_DIMENSION_COMPOSITE_ALPHA:
    pVVar6 = (pointer)(ulong)local_fc.supportedCompositeAlpha;
    if (local_fc.supportedCompositeAlpha != 0) {
      VVar12 = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
      iVar7._M_current = (VkSwapchainCreateInfoKHR *)0x0;
      do {
        if ((VVar12 & (VkCompositeAlphaFlagBitsKHR)pVVar6) != 0) {
          if (iVar7._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
            _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                      ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                        *)__return_storage_ptr__,iVar7,&local_98);
            iVar7._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            pVVar6 = (pointer)(ulong)local_fc.supportedCompositeAlpha;
          }
          else {
            pVVar15 = &local_98;
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              uVar3 = *(undefined4 *)&pVVar15->field_0x4;
              (iVar7._M_current)->sType = pVVar15->sType;
              *(undefined4 *)&(iVar7._M_current)->field_0x4 = uVar3;
              pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + (ulong)bVar17 * -0x10 + 8);
              iVar7._M_current = iVar7._M_current + (ulong)bVar17 * -0x10 + 8;
            }
            iVar7._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1;
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current;
          }
          iVar7._M_current[-1].compositeAlpha = VVar12;
        }
        VVar12 = VVar12 * 2;
      } while (VVar12 <= (VkCompositeAlphaFlagBitsKHR)pVVar6);
    }
    break;
  case TEST_DIMENSION_PRESENT_MODE:
    pVVar6 = (pointer)local_c8.
                      super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (local_c8.super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_c8.super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      iVar7._M_current = (VkSwapchainCreateInfoKHR *)0x0;
      pVVar16 = (pointer)local_c8.
                         super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (iVar7._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
          _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                    ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                      *)__return_storage_ptr__,iVar7,&local_98);
          iVar7._M_current =
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          pVVar6 = (pointer)local_c8.
                            super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          pVVar15 = &local_98;
          for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
            uVar3 = *(undefined4 *)&pVVar15->field_0x4;
            (iVar7._M_current)->sType = pVVar15->sType;
            *(undefined4 *)&(iVar7._M_current)->field_0x4 = uVar3;
            pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + (ulong)bVar17 * -0x10 + 8);
            iVar7._M_current = iVar7._M_current + (ulong)bVar17 * -0x10 + 8;
          }
          iVar7._M_current =
               (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish + 1;
          (__return_storage_ptr__->
          super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current;
        }
        iVar7._M_current[-1].presentMode =
             *(VkPresentModeKHR *)
              &(((_Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
                  *)&pVVar16->sType)->_M_impl).super__Vector_impl_data._M_start;
        pVVar16 = (pointer)&pVVar16->field_0x4;
      } while (pVVar16 != pVVar6);
    }
    break;
  case TEST_DIMENSION_CLIPPED:
    std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
    _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
              ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>> *)
               __return_storage_ptr__,(iterator)0x0,&local_98);
    iVar7._M_current =
         (__return_storage_ptr__->
         super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    pVVar15 = (__return_storage_ptr__->
              super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar7._M_current[-1].clipped = 0;
    if (iVar7._M_current == pVVar15) {
      std::vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>::
      _M_realloc_insert<vk::VkSwapchainCreateInfoKHR_const&>
                ((vector<vk::VkSwapchainCreateInfoKHR,std::allocator<vk::VkSwapchainCreateInfoKHR>>
                  *)__return_storage_ptr__,iVar7,&local_98);
      pVVar6 = (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      pVVar15 = &local_98;
      for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
        uVar3 = *(undefined4 *)&pVVar15->field_0x4;
        (iVar7._M_current)->sType = pVVar15->sType;
        *(undefined4 *)&(iVar7._M_current)->field_0x4 = uVar3;
        pVVar15 = (VkSwapchainCreateInfoKHR *)((long)pVVar15 + ((ulong)bVar17 * -2 + 1) * 8);
        iVar7._M_current = iVar7._M_current + (ulong)bVar17 * -0x10 + 8;
      }
      pVVar6 = (__return_storage_ptr__->
               super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
               )._M_impl.super__Vector_impl_data._M_finish + 1;
      (__return_storage_ptr__->
      super__Vector_base<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_>
      )._M_impl.super__Vector_impl_data._M_finish = pVVar6;
    }
    pVVar6[-1].clipped = 1;
  }
  if ((pointer)local_c8.
               super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    pVVar6 = extraout_RAX_00;
  }
  if ((pointer)local_b0.
               super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.
                          super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.
                          super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    pVVar6 = extraout_RAX_01;
  }
  return (vector<vk::VkSwapchainCreateInfoKHR,_std::allocator<vk::VkSwapchainCreateInfoKHR>_> *)
         pVVar6;
}

Assistant:

vector<VkSwapchainCreateInfoKHR> generateSwapchainParameterCases (Type								wsiType,
																  TestDimension						dimension,
																  const InstanceInterface&			vki,
																  VkPhysicalDevice					physicalDevice,
																  VkSurfaceKHR						surface)
{
	const VkSurfaceCapabilitiesKHR		capabilities	= getPhysicalDeviceSurfaceCapabilities(vki,
																							   physicalDevice,
																							   surface);
	const vector<VkSurfaceFormatKHR>	formats			= getPhysicalDeviceSurfaceFormats(vki,
																						  physicalDevice,
																						  surface);
	const vector<VkPresentModeKHR>		presentModes	= getPhysicalDeviceSurfacePresentModes(vki,
																							   physicalDevice,
																							   surface);

	return generateSwapchainParameterCases(wsiType, dimension, capabilities, formats, presentModes);
}